

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O0

void * ngx_http_index_create_loc_conf(ngx_conf_t *cf)

{
  ngx_http_index_loc_conf_t *conf;
  ngx_conf_t *cf_local;
  
  cf_local = (ngx_conf_t *)ngx_palloc(cf->pool,0x10);
  if (cf_local == (ngx_conf_t *)0x0) {
    cf_local = (ngx_conf_t *)0x0;
  }
  else {
    cf_local->name = (char *)0x0;
    cf_local->args = (ngx_array_t *)0x0;
  }
  return cf_local;
}

Assistant:

static void *
ngx_http_index_create_loc_conf(ngx_conf_t *cf)
{
    ngx_http_index_loc_conf_t  *conf;

    conf = ngx_palloc(cf->pool, sizeof(ngx_http_index_loc_conf_t));
    if (conf == NULL) {
        return NULL;
    }

    conf->indices = NULL;
    conf->max_index_len = 0;

    return conf;
}